

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrs.h
# Opt level: O0

int Psr_NtkMemory(Psr_Ntk_t *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int nMem;
  Psr_Ntk_t *p_local;
  
  dVar1 = Vec_IntMemory(&p->vOrder);
  dVar2 = Vec_IntMemory(&p->vInouts);
  dVar3 = Vec_IntMemory(&p->vInputs);
  dVar4 = Vec_IntMemory(&p->vOutputs);
  dVar5 = Vec_IntMemory(&p->vWires);
  dVar6 = Vec_IntMemory(&p->vInoutsR);
  dVar7 = Vec_IntMemory(&p->vInputsR);
  dVar8 = Vec_IntMemory(&p->vOutputsR);
  dVar9 = Vec_IntMemory(&p->vWiresR);
  dVar10 = Vec_IntMemory(&p->vSlices);
  dVar11 = Vec_IntMemory(&p->vBoxes);
  dVar12 = Vec_IntMemory(&p->vConcats);
  return (int)((double)(int)((double)(int)((double)(int)((double)(int)((double)(int)((double)(int)((
                                                  double)(int)((double)(int)((double)(int)((double)(
                                                  int)((double)(int)(dVar1 + 224.0) + dVar2) + dVar3
                                                  ) + dVar4) + dVar5) + dVar6) + dVar7) + dVar8) +
                                                  dVar9) + dVar10) + dVar11) + dVar12);
}

Assistant:

static inline int Psr_NtkMemory( Psr_Ntk_t * p )
{
    int nMem = sizeof(Psr_Ntk_t);
    nMem += Vec_IntMemory( &p->vOrder );
    nMem += Vec_IntMemory( &p->vInouts );
    nMem += Vec_IntMemory( &p->vInputs );
    nMem += Vec_IntMemory( &p->vOutputs );
    nMem += Vec_IntMemory( &p->vWires );
    nMem += Vec_IntMemory( &p->vInoutsR );
    nMem += Vec_IntMemory( &p->vInputsR );
    nMem += Vec_IntMemory( &p->vOutputsR );
    nMem += Vec_IntMemory( &p->vWiresR );
    nMem += Vec_IntMemory( &p->vSlices );
    nMem += Vec_IntMemory( &p->vBoxes );
    nMem += Vec_IntMemory( &p->vConcats );
    return nMem;
}